

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

int mg::fs::MappedFile::open(char *__file,int __oflag,...)

{
  size_t __len;
  __off_t _Var1;
  uint8_t *data;
  MappedFile *this;
  void *mmapped_data;
  off_t file_size;
  undefined1 local_30 [8];
  shared_ptr<void> _defer_close_fd;
  int file_fd;
  char *filename_local;
  
  _defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       ::open(___oflag,0);
  if (_defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <
      0) {
    std::unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>>::
    unique_ptr<std::default_delete<mg::fs::MappedFile>,void>
              ((unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>> *)__file,
               (nullptr_t)0x0);
  }
  else {
    std::shared_ptr<void>::shared_ptr<mg::fs::MappedFile::open(char_const*)::__0>
              ((shared_ptr<void> *)local_30,(nullptr_t)0x0,
               _defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._4_4_);
    __len = lseek(_defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_4_,0,2);
    if ((long)__len < 0) {
      std::unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>>::
      unique_ptr<std::default_delete<mg::fs::MappedFile>,void>
                ((unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>> *)__file,
                 (nullptr_t)0x0);
    }
    else {
      _Var1 = lseek(_defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi._4_4_,0,0);
      if (_Var1 < 0) {
        std::unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>>::
        unique_ptr<std::default_delete<mg::fs::MappedFile>,void>
                  ((unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>> *)__file,
                   (nullptr_t)0x0);
      }
      else {
        data = (uint8_t *)
               mmap((void *)0x0,__len,1,2,
                    _defer_close_fd.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi._4_4_,0);
        if (data == (uint8_t *)0x0) {
          std::unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>>::
          unique_ptr<std::default_delete<mg::fs::MappedFile>,void>
                    ((unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>> *)
                     __file,(nullptr_t)0x0);
        }
        else {
          this = (MappedFile *)operator_new(0x10);
          MappedFile(this,data,__len);
          std::unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>>::
          unique_ptr<std::default_delete<mg::fs::MappedFile>,void>
                    ((unique_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>> *)
                     __file,this);
        }
      }
    }
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_30);
  }
  return (int)__file;
}

Assistant:

std::unique_ptr<MappedFile> MappedFile::open(const char *filename) {
  int file_fd = ::open(filename, O_RDONLY);
  if (file_fd < 0) {
    return nullptr;
  }

  std::shared_ptr<void> _defer_close_fd(nullptr,
                                        [=](...) { ::close(file_fd); });

  const off_t file_size = ::lseek(file_fd, 0, SEEK_END);
  if (file_size < 0) {
    return nullptr;
  }
  if (lseek(file_fd, 0, SEEK_SET) < 0) {
    return nullptr;
  }

  void *mmapped_data =
      mmap(nullptr, file_size, PROT_READ, MAP_PRIVATE, file_fd, 0);

  if (mmapped_data == nullptr) {
    return nullptr;
  }

  return std::unique_ptr<MappedFile>(
      new MappedFile(reinterpret_cast<uint8_t *>(mmapped_data), file_size));
}